

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

int __thiscall Imf_2_5::DeepTiledInputFile::numYTiles(DeepTiledInputFile *this,int ly)

{
  ostream *poVar1;
  char *pcVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((-1 < ly) && (ly < this->_data->numYLevels)) {
    return this->_data->numYTiles[(uint)ly];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Error calling numYTiles() on image file \"");
  pcVar2 = IStream::fileName(this->_data->_streamData->is);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (Argument is not in valid range).");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

int
DeepTiledInputFile::numYTiles (int ly) const
{
    if (ly < 0 || ly >= _data->numYLevels)
    {
        THROW (IEX_NAMESPACE::ArgExc, "Error calling numYTiles() on image "
                            "file \"" << _data->_streamData->is->fileName() << "\" "
                            "(Argument is not in valid range).");
    }

    return _data->numYTiles[ly];
}